

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayCreation.h
# Opt level: O2

Expression * CreateArray(Expression *array_size)

{
  EseqExpression *this;
  ExpressionList *this_00;
  BinopExpression *this_01;
  ConstExpression *this_02;
  BinopExpression *this_03;
  ConstExpression *this_04;
  MoveStatement *this_05;
  MemExpression *this_06;
  TempExpression *pTVar1;
  allocator<char> local_129;
  MoveStatement *local_128;
  SeqStatement *local_120;
  CallExpression *local_118;
  NameExpression *local_110;
  TempExpression *local_108;
  MoveStatement *local_100;
  EseqExpression *local_f8;
  Temporary tmp;
  Temporary local_d0;
  Temporary local_b0;
  string local_90;
  Label local_70;
  Temporary local_50;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_00161f48;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (BinopExpression *)operator_new(0x20);
  this_02 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_02,4);
  this_03 = (BinopExpression *)operator_new(0x20);
  this_04 = (ConstExpression *)operator_new(0x10);
  IRT::ConstExpression::ConstExpression(this_04,1);
  IRT::BinopExpression::BinopExpression(this_03,PLUS,array_size,(Expression *)this_04);
  IRT::BinopExpression::BinopExpression(this_01,MUL,(Expression *)this_02,(Expression *)this_03);
  IRT::ExpressionList::Add(this_00,(Expression *)this_01);
  IRT::Temporary::Temporary(&tmp);
  local_f8 = (EseqExpression *)operator_new(0x18);
  local_120 = (SeqStatement *)operator_new(0x18);
  this_05 = (MoveStatement *)operator_new(0x18);
  local_100 = this_05;
  local_108 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_50,(string *)&tmp);
  IRT::TempExpression::TempExpression(local_108,&local_50);
  local_118 = (CallExpression *)operator_new(0x18);
  local_110 = (NameExpression *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"malloc",&local_129);
  IRT::Label::Label(&local_70,&local_90);
  IRT::NameExpression::NameExpression(local_110,&local_70);
  IRT::CallExpression::CallExpression(local_118,&local_110->super_Expression,this_00);
  IRT::MoveStatement::MoveStatement
            (this_05,&local_108->super_Expression,&local_118->super_Expression);
  local_128 = (MoveStatement *)operator_new(0x18);
  this_06 = (MemExpression *)operator_new(0x10);
  pTVar1 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_b0,(string *)&tmp);
  IRT::TempExpression::TempExpression(pTVar1,&local_b0);
  IRT::MemExpression::MemExpression(this_06,(Expression *)pTVar1);
  IRT::MoveStatement::MoveStatement(local_128,(Expression *)this_06,array_size);
  IRT::SeqStatement::SeqStatement(local_120,&local_100->super_Statement,&local_128->super_Statement)
  ;
  pTVar1 = (TempExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_d0,(string *)&tmp);
  this = local_f8;
  IRT::TempExpression::TempExpression(pTVar1,&local_d0);
  IRT::EseqExpression::EseqExpression(this,&local_120->super_Statement,(Expression *)pTVar1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&tmp);
  return &this->super_Expression;
}

Assistant:

IRT::Expression* CreateArray(IRT::Expression* array_size) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::BinopExpression(
      IRT::BinaryOperatorType::MUL, new IRT::ConstExpression(COMPILER_WORD_SIZE),
      new IRT::BinopExpression(IRT::BinaryOperatorType::PLUS, array_size,
                               new IRT::ConstExpression(1))));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::SeqStatement(
          new IRT::MoveStatement(
              new IRT::TempExpression(tmp),
              new IRT::CallExpression(
                  new IRT::NameExpression(IRT::Label("malloc")),
                  irt_expressions)),
          new IRT::MoveStatement(
              new IRT::MemExpression(new IRT::TempExpression(tmp)),
              array_size)),
      new IRT::TempExpression(tmp));
}